

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSqueezeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr *pp_Var3;
  uint uVar4;
  pointer pcVar5;
  _Base_ptr p_Var6;
  long lVar7;
  bool bVar8;
  long *plVar9;
  undefined1 *puVar10;
  LogMessage *pLVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  int **ppiVar13;
  _Base_ptr p_Var14;
  size_type *psVar15;
  int *piVar16;
  int *piVar17;
  Result *_result;
  int *piVar18;
  int *piVar19;
  _Rb_tree_header *p_Var20;
  iterator iVar21;
  int iVar22;
  int iVar23;
  string err_2;
  int a;
  vector<int,_std::allocator<int>_> axes;
  string err;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  string local_168;
  int local_144;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  uint local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  int *local_f8;
  iterator iStack_f0;
  int *local_e8;
  int local_dc;
  undefined1 local_d8 [56];
  undefined1 local_a0 [16];
  int *local_90;
  _Alloc_hider _Stack_88;
  int *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar5 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  if (layer->_oneof_case_[0] == 0x460) {
    puVar10 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar10 = Specification::_SqueezeLayerParams_default_instance_;
  }
  if (((SqueezeLayerParams *)puVar10)->squeezeall_ == false) {
    if ((((ConvolutionLayerParams *)puVar10)->kernelsize_).current_size_ == 0) {
      plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      pp_Var3 = &local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      lVar7 = *plVar9;
      local_60._M_impl._0_8_ = pp_Var3;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,lVar7,plVar9[1] + lVar7);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x3e42a3);
      ppiVar13 = (int **)(plVar9 + 2);
      if ((int **)*plVar9 == ppiVar13) {
        local_90 = *ppiVar13;
        _Stack_88._M_p = (pointer)plVar9[3];
        local_a0._0_8_ = &local_90;
      }
      else {
        local_90 = *ppiVar13;
        local_a0._0_8_ = (int **)*plVar9;
      }
      local_a0._8_8_ = plVar9[1];
      *plVar9 = (long)ppiVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append(local_a0);
      psVar15 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar15) {
        local_d8._16_8_ = *psVar15;
        local_d8._24_8_ = plVar9[3];
        local_d8._0_8_ = local_d8 + 0x10;
      }
      else {
        local_d8._16_8_ = *psVar15;
        local_d8._0_8_ = (size_type *)*plVar9;
      }
      local_d8._8_8_ = plVar9[1];
      *plVar9 = (long)psVar15;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((int **)local_a0._0_8_ != &local_90) {
        operator_delete((void *)local_a0._0_8_,(long)local_90 + 1);
      }
      if ((_Base_ptr *)local_60._M_impl._0_8_ != pp_Var3) {
        operator_delete((void *)local_60._M_impl._0_8_,
                        (ulong)((long)&(local_60._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d8);
      if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      return __return_storage_ptr__;
    }
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    if (layer->_oneof_case_[0] == 0x460) {
      puVar10 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar10 = Specification::_SqueezeLayerParams_default_instance_;
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    if (0 < (((ConvolutionLayerParams *)puVar10)->kernelsize_).current_size_) {
      iVar22 = 0;
      do {
        plVar9 = google::protobuf::RepeatedField<long>::Get
                           (&((ReshapeLayerParams *)puVar10)->targetshape_,iVar22);
        iVar23 = (int)*plVar9;
        local_140._M_dataplus._M_p._0_4_ = iVar23;
        p_Var14 = &p_Var2->_M_header;
        for (p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
            p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < iVar23]) {
          if (iVar23 <= (int)*(size_t *)(p_Var6 + 1)) {
            p_Var14 = p_Var6;
          }
        }
        p_Var20 = p_Var2;
        if (((_Rb_tree_header *)p_Var14 != p_Var2) &&
           (p_Var20 = (_Rb_tree_header *)p_Var14,
           iVar23 < (int)((_Rb_tree_header *)p_Var14)->_M_node_count)) {
          p_Var20 = p_Var2;
        }
        if (p_Var20 == p_Var2) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,(int *)&local_140);
        }
        else {
          plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          lVar7 = *plVar9;
          std::__cxx11::string::_M_construct<char*>((string *)&local_168,lVar7,plVar9[1] + lVar7);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x3e42a3);
          local_a0._0_8_ = &local_90;
          ppiVar13 = (int **)(plVar9 + 2);
          if ((int **)*plVar9 == ppiVar13) {
            local_90 = *ppiVar13;
            _Stack_88._M_p = (pointer)plVar9[3];
          }
          else {
            local_90 = *ppiVar13;
            local_a0._0_8_ = (int **)*plVar9;
          }
          local_a0._8_8_ = plVar9[1];
          *plVar9 = (long)ppiVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append(local_a0);
          local_d8._0_8_ = local_d8 + 0x10;
          psVar15 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar15) {
            local_d8._16_8_ = *psVar15;
            local_d8._24_8_ = plVar9[3];
          }
          else {
            local_d8._16_8_ = *psVar15;
            local_d8._0_8_ = (size_type *)*plVar9;
          }
          local_d8._8_8_ = plVar9[1];
          *plVar9 = (long)psVar15;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((int **)local_a0._0_8_ != &local_90) {
            operator_delete((void *)local_a0._0_8_,(long)local_90 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d8);
          if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
        }
        if (p_Var20 != p_Var2) goto LAB_0036fac8;
        puVar10 = Specification::_SqueezeLayerParams_default_instance_;
        if (layer->_oneof_case_[0] == 0x460) {
          puVar10 = *(undefined1 **)&layer->layer_;
        }
        iVar22 = iVar22 + 1;
      } while (iVar22 < (((ConvolutionLayerParams *)puVar10)->kernelsize_).current_size_);
    }
    if ((0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) &&
       (0 < (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_)) {
      if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_d8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a0);
      }
      uVar4 = *(uint *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                       0x24);
      if ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_d8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_168,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d8);
      }
      if (layer->_oneof_case_[0] == 0x460) {
        puVar10 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar10 = Specification::_SqueezeLayerParams_default_instance_;
      }
      iVar22 = (((ConvolutionLayerParams *)puVar10)->kernelsize_).current_size_;
      if ((uVar4 != 1) &&
         (*(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                  0x24) + iVar22 != uVar4)) {
        plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        lVar7 = *plVar9;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_118,lVar7,plVar9[1] + lVar7);
        std::operator+(&local_140,"Squeeze Layer \'",&local_118);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
        psVar15 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_168.field_2._M_allocated_capacity = *psVar15;
          local_168.field_2._8_8_ = plVar9[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar15;
          local_168._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_168._M_string_length = plVar9[1];
        *plVar9 = (long)psVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
LAB_0036fac8:
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_60);
        return __return_storage_ptr__;
      }
      local_f8 = (int *)0x0;
      iStack_f0._M_current = (int *)0x0;
      local_e8 = (int *)0x0;
      bVar8 = 0 < iVar22;
      local_11c = uVar4;
      if (0 < iVar22) {
        iVar23 = 0;
        local_dc = iVar22;
        do {
          puVar10 = Specification::_SqueezeLayerParams_default_instance_;
          if (layer->_oneof_case_[0] == 0x460) {
            puVar10 = *(undefined1 **)&layer->layer_;
          }
          plVar9 = google::protobuf::RepeatedField<long>::Get
                             (&((ReshapeLayerParams *)puVar10)->targetshape_,iVar23);
          local_144 = ((int)*plVar9 >> 0x1f & local_11c) + (int)*plVar9;
          _Var12 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             (local_f8,iStack_f0._M_current,&local_144);
          iVar21._M_current = iStack_f0._M_current;
          if (_Var12._M_current == iStack_f0._M_current) {
            if (iStack_f0._M_current == local_e8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_f8,iStack_f0,&local_144);
            }
            else {
              *iStack_f0._M_current = local_144;
              iStack_f0._M_current = iStack_f0._M_current + 1;
            }
          }
          else {
            local_68 = iStack_f0._M_current;
            plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            lVar7 = *plVar9;
            std::__cxx11::string::_M_construct<char*>((string *)&local_118,lVar7,plVar9[1] + lVar7);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x3e42a3)
            ;
            psVar15 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_140.field_2._M_allocated_capacity = *psVar15;
              local_140.field_2._8_8_ = plVar9[3];
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar15;
              local_140._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_140._M_string_length = plVar9[1];
            *plVar9 = (long)psVar15;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            psVar15 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_168.field_2._M_allocated_capacity = *psVar15;
              local_168.field_2._8_8_ = plVar9[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = *psVar15;
              local_168._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_168._M_string_length = plVar9[1];
            *plVar9 = (long)psVar15;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_168);
            iVar21._M_current = local_68;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
              iVar21._M_current = local_68;
            }
          }
          if (_Var12._M_current != iVar21._M_current) {
            if (bVar8) goto LAB_0036fa8d;
            break;
          }
          iVar23 = iVar23 + 1;
          bVar8 = iVar23 < local_dc;
        } while (iVar23 != local_dc);
      }
      piVar16 = local_f8 + 1;
      piVar17 = piVar16;
      piVar18 = local_f8;
      piVar19 = local_f8;
      if (piVar16 != iStack_f0._M_current && local_f8 != iStack_f0._M_current) {
        do {
          piVar18 = piVar17;
          if (*piVar17 <= *piVar19) {
            piVar18 = piVar19;
          }
          piVar17 = piVar17 + 1;
          piVar19 = piVar18;
        } while (piVar17 != iStack_f0._M_current);
      }
      piVar17 = local_f8;
      if (piVar16 != iStack_f0._M_current && local_f8 != iStack_f0._M_current) {
        do {
          piVar19 = piVar16;
          if (*piVar17 <= *piVar16) {
            piVar19 = piVar17;
          }
          piVar17 = piVar19;
          piVar16 = piVar16 + 1;
        } while (piVar16 != iStack_f0._M_current);
      }
      if (((int)local_11c <= *piVar18) || (bVar8 = true, *piVar17 < 0)) {
        plVar9 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        lVar7 = *plVar9;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_118,lVar7,plVar9[1] + lVar7);
        std::operator+(&local_140,"Squeeze Layer \'",&local_118);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_140);
        psVar15 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_168.field_2._M_allocated_capacity = *psVar15;
          local_168.field_2._8_8_ = plVar9[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar15;
          local_168._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_168._M_string_length = plVar9[1];
        *plVar9 = (long)psVar15;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
LAB_0036fa8d:
        bVar8 = false;
      }
      if (local_f8 != (int *)0x0) {
        operator_delete(local_f8,(long)local_e8 - (long)local_f8);
      }
      if (!bVar8) goto LAB_0036fac8;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSqueezeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (!layer.squeeze().squeezeall()) {

        if (layer.squeeze().axes_size() == 0) {
            std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        // either all values in axes must be positive or all negative
        std::set<int> axes_set;
        for (int i=0; i<layer.squeeze().axes_size(); i++) {
            int a = (int)layer.squeeze().axes(i);
            if (axes_set.find(a) != axes_set.end()) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            } else {
                axes_set.insert(a);
            }
        }

        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            int input_rank = static_cast<int>(layer.inputtensor(0).rank());
            int output_rank = static_cast<int>(layer.outputtensor(0).rank());
            int axes_length = layer.squeeze().axes_size();

            if (input_rank != 1) {
                if (output_rank + axes_length != input_rank) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': output rank plus the length of the axes parameter must equal input rank.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }

            std::vector<int> axes;
            for (int i=0; i<axes_length; i++) {
                int a = (int)layer.squeeze().axes(i);
                if (a < 0) {
                    a = input_rank + a;
                }
                if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                axes.push_back(a);
            }

            int max_value = *std::max_element(axes.begin(), axes.end());
            int min_value = *std::min_element(axes.begin(), axes.end());
            if (max_value > input_rank - 1 || min_value < 0) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the input rank.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return Result();
}